

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O1

void sssort64(sauchar_t *T,saidx64_t *PA,saidx64_t *first,saidx64_t *last,saidx64_t *buf,
             saidx64_t bufsize,saidx64_t depth,saidx64_t n,saint_t lastsuffix)

{
  byte *pbVar1;
  ulong uVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong *last_00;
  ulong *puVar9;
  ulong uVar10;
  sauchar_t *psVar11;
  ulong *puVar12;
  ulong *puVar13;
  int iVar14;
  ulong uVar15;
  byte *pbVar16;
  ulong *puVar17;
  ulong *puVar18;
  sauchar_t *psVar19;
  byte *pbVar20;
  long lVar21;
  ulong uVar22;
  byte *pbVar23;
  ulong *puVar24;
  ulong *puVar25;
  byte *pbVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  ulong *local_70;
  
  puVar25 = (ulong *)(first + (lastsuffix != 0));
  bVar29 = true;
  last_00 = (ulong *)last;
  local_70 = (ulong *)buf;
  if (0x3ff < bufsize) goto LAB_00101c64;
  uVar8 = (long)last - (long)puVar25;
  uVar10 = (long)uVar8 >> 3;
  if ((long)uVar10 <= bufsize) goto LAB_00101c64;
  lVar6 = 0x400;
  if ((long)uVar10 < 0x100000) {
    if ((uVar8 & 0x7fff80000) == 0) {
      if ((uVar8 & 0x7f800) == 0) {
        uVar7 = lg_table[uVar10 & 0xff];
      }
      else {
        uVar7 = lg_table[uVar10 >> 8 & 0xff] + 8;
      }
    }
    else if ((uVar8 & 0x7f8000000) == 0) {
      uVar7 = *(int *)((long)lg_table + (ulong)((uint)(uVar10 >> 0xe) & 0x3fc)) + 0x10;
    }
    else {
      uVar7 = lg_table[uVar10 >> 0x18 & 0xff] + 0x18;
    }
    if ((int)uVar7 < 0x10) {
      if ((int)uVar7 < 8) {
        lVar6 = (long)(sqq_table[uVar10] >> 4);
        goto LAB_0010233d;
      }
      lVar6 = (long)((sqq_table[(long)uVar10 >> (((byte)uVar7 & 0xfe) - 6 & 0x3f)] >>
                     (7U - (char)(uVar7 >> 1) & 0x1f)) + 1);
    }
    else {
      lVar6 = (long)(sqq_table[(long)uVar10 >> (((byte)uVar7 & 0xfe) - 6 & 0x3f)] <<
                    ((char)(uVar7 >> 1) - 7U & 0x1f));
      if (0x17 < (int)uVar7) {
        lVar6 = lVar6 + (long)uVar10 / lVar6 + 1 >> 1;
      }
      lVar6 = (long)uVar10 / lVar6 + lVar6 + 1 >> 1;
    }
    lVar6 = lVar6 - (ulong)(lVar6 * lVar6 - uVar10 != 0 && (long)uVar10 <= lVar6 * lVar6);
  }
LAB_0010233d:
  if (bufsize < lVar6) {
    bufsize = 0x400;
    if (lVar6 < 0x400) {
      bufsize = lVar6;
    }
    local_70 = (ulong *)(last + -bufsize);
    bVar29 = lVar6 == 0;
    last_00 = local_70;
  }
LAB_00101c64:
  if ((long)last_00 - (long)puVar25 < 0x2001) {
    uVar8 = 0;
    puVar9 = puVar25;
  }
  else {
    uVar8 = 0;
    puVar12 = puVar25;
    do {
      puVar9 = puVar12 + 0x400;
      ss_mintrosort(T,PA,(saidx64_t *)puVar12,(saidx64_t *)puVar9,depth);
      lVar6 = (long)last - (long)puVar9 >> 3;
      puVar18 = puVar9;
      if (lVar6 <= bufsize) {
        lVar6 = bufsize;
        puVar18 = local_70;
      }
      if ((uVar8 & 1) != 0) {
        lVar21 = 0x400;
        uVar10 = uVar8;
        do {
          lVar4 = -lVar21;
          ss_swapmerge(T,PA,(saidx64_t *)(puVar12 + lVar4),(saidx64_t *)puVar12,
                       (saidx64_t *)(puVar12 + lVar21),(saidx64_t *)puVar18,lVar6,depth);
          lVar21 = lVar21 * 2;
          uVar22 = uVar10 & 2;
          puVar12 = puVar12 + lVar4;
          uVar10 = uVar10 >> 1;
        } while (uVar22 != 0);
      }
      uVar8 = uVar8 + 1;
      puVar12 = puVar9;
    } while (0x2000 < (long)last_00 - (long)puVar9);
  }
  ss_mintrosort(T,PA,(saidx64_t *)puVar9,(saidx64_t *)last_00,depth);
  if (uVar8 != 0) {
    lVar6 = 0x400;
    do {
      puVar12 = puVar9;
      if ((uVar8 & 1) != 0) {
        puVar12 = puVar9 + -lVar6;
        ss_swapmerge(T,PA,(saidx64_t *)puVar12,(saidx64_t *)puVar9,(saidx64_t *)last_00,
                     (saidx64_t *)local_70,bufsize,depth);
      }
      lVar6 = lVar6 * 2;
      bVar27 = 1 < uVar8;
      uVar8 = uVar8 >> 1;
      puVar9 = puVar12;
    } while (bVar27);
  }
  if (!bVar29) {
    ss_mintrosort(T,PA,(saidx64_t *)last_00,last,depth);
    puVar9 = (ulong *)last;
    do {
      uVar8 = puVar9[-1];
      lVar6 = (long)last_00 - (long)puVar25 >> 3;
      puVar12 = puVar25;
      if (lVar6 < 1) {
        bVar29 = false;
      }
      else {
        lVar21 = (long)last_00 - (long)puVar25 >> 4;
        uVar10 = (long)uVar8 >> 0x3f ^ uVar8;
        pbVar1 = T + PA[uVar10] + depth;
        pbVar26 = T + PA[uVar10 + 1] + 2;
        iVar14 = -1;
        do {
          uVar22 = (long)puVar12[lVar21] >> 0x3f ^ puVar12[lVar21];
          pbVar16 = T + PA[uVar22] + depth;
          bVar29 = pbVar16 < T + PA[uVar22 + 1] + 2;
          pbVar23 = pbVar1;
          bVar27 = pbVar1 < pbVar26;
          if ((bVar29) && (pbVar1 < pbVar26)) {
            bVar29 = true;
            bVar27 = true;
            if (*pbVar16 == *pbVar1) {
              psVar11 = T + PA[uVar22] + 1;
              psVar19 = T + PA[uVar10] + 1;
              do {
                pbVar16 = psVar11 + depth;
                pbVar23 = psVar19 + depth;
                bVar27 = pbVar23 < pbVar26;
                bVar29 = pbVar16 < T + PA[uVar22 + 1] + 2;
                if ((!bVar29) || (pbVar26 <= pbVar23)) goto LAB_00101f78;
                psVar19 = psVar19 + 1;
                psVar11 = psVar11 + 1;
              } while (*pbVar16 == *pbVar23);
              bVar29 = true;
              bVar27 = true;
            }
          }
LAB_00101f78:
          if (bVar29) {
            iVar5 = 1;
            if (bVar27 != false) {
              iVar5 = (uint)*pbVar16 - (uint)*pbVar23;
            }
          }
          else {
            iVar5 = -(uint)bVar27;
          }
          uVar22 = (ulong)(~(uint)lVar6 & 1);
          puVar18 = puVar12 + lVar21 + 1;
          if (-1 < iVar5) {
            uVar22 = 0;
            puVar18 = puVar12;
            iVar14 = iVar5;
          }
          puVar12 = puVar18;
          lVar6 = lVar21 - uVar22;
          lVar21 = lVar6 >> 1;
        } while (0 < lVar6);
        bVar29 = iVar14 == 0;
      }
      if (puVar12 < last_00) {
        if (bVar29) {
          *puVar12 = ~*puVar12;
        }
        uVar10 = (long)last_00 - (long)puVar12 >> 3;
        if ((0 < (long)uVar10) && (uVar22 = (long)puVar9 - (long)last_00 >> 3, 0 < (long)uVar22)) {
          uVar15 = uVar10;
          puVar18 = puVar12;
          puVar24 = puVar9;
LAB_0010202c:
          if (uVar15 != uVar22) goto code_r0x00102035;
          lVar21 = uVar15 + 1;
          lVar6 = 0;
          do {
            uVar3 = *(undefined8 *)((long)puVar18 + lVar6);
            *(undefined8 *)((long)puVar18 + lVar6) = *(undefined8 *)((long)last_00 + lVar6);
            *(undefined8 *)((long)last_00 + lVar6) = uVar3;
            lVar6 = lVar6 + 8;
            lVar21 = lVar21 + -1;
          } while (1 < lVar21);
        }
LAB_001020dc:
        if (puVar12 == puVar25) break;
        puVar9 = puVar9 + -uVar10;
        last_00 = puVar12;
      }
      while (puVar9 = puVar9 + -1, (long)uVar8 < 0) {
        uVar8 = puVar9[-1];
      }
    } while (last_00 != puVar9);
  }
  if (lastsuffix != 0) {
    uVar8 = puVar25[-1];
    if (puVar25 < last) {
      lVar6 = PA[uVar8];
      pbVar1 = T + lVar6 + depth;
      pbVar26 = T + n;
      bVar29 = pbVar1 < pbVar26;
      do {
        uVar10 = *puVar25;
        if (-1 < (long)uVar10) {
          pbVar16 = T + PA[uVar10] + depth;
          pbVar20 = T + PA[uVar10 + 1] + 2;
          bVar28 = pbVar16 < pbVar20;
          pbVar23 = pbVar1;
          bVar27 = bVar29;
          if (((pbVar1 < pbVar26) && (pbVar16 < pbVar20)) && (*pbVar1 == *pbVar16)) {
            psVar11 = T + PA[uVar10] + 1;
            psVar19 = T + lVar6;
            do {
              psVar19 = psVar19 + 1;
              pbVar23 = psVar19 + depth;
              pbVar16 = psVar11 + depth;
              bVar28 = pbVar16 < pbVar20;
              bVar27 = pbVar23 < pbVar26;
              if ((!bVar27) || (pbVar20 <= pbVar16)) break;
              psVar11 = psVar11 + 1;
            } while (*pbVar23 == *pbVar16);
          }
          if ((!bVar27) || ((bVar28 && (*pbVar23 <= *pbVar16)))) break;
        }
        puVar25[-1] = uVar10;
        puVar25 = puVar25 + 1;
      } while (puVar25 < last);
    }
    puVar25[-1] = uVar8;
  }
  return;
code_r0x00102035:
  if ((long)uVar15 < (long)uVar22) {
    do {
      puVar24 = puVar24 + -1;
      uVar2 = *puVar24;
      puVar13 = last_00 + -1;
      do {
        *puVar24 = *puVar13;
        puVar17 = puVar24 + -1;
        puVar24 = puVar24 + -1;
        *puVar13 = *puVar17;
        puVar13 = puVar13 + -1;
      } while (puVar18 <= puVar13);
      *puVar24 = uVar2;
      uVar22 = uVar22 + ~uVar15;
    } while ((long)uVar15 < (long)uVar22);
  }
  else {
    do {
      uVar2 = *puVar18;
      puVar13 = last_00;
      puVar18 = puVar18 + 1;
      do {
        puVar17 = puVar18;
        puVar17[-1] = *puVar13;
        *puVar13 = *puVar17;
        puVar13 = puVar13 + 1;
        puVar18 = puVar17 + 1;
      } while (puVar13 < puVar24);
      *puVar17 = uVar2;
      uVar15 = uVar15 + ~uVar22;
    } while ((long)uVar22 < (long)uVar15);
  }
  if (((long)uVar15 < 1) || ((long)uVar22 < 1)) goto LAB_001020dc;
  goto LAB_0010202c;
}

Assistant:

void
sssort(const sauchar_t *T, const saidx_t *PA,
       saidx_t *first, saidx_t *last,
       saidx_t *buf, saidx_t bufsize,
       saidx_t depth, saidx_t n, saint_t lastsuffix) {
  saidx_t *a;
#if SS_BLOCKSIZE != 0
  saidx_t *b, *middle, *curbuf;
  saidx_t j, k, curbufsize, limit;
#endif
  saidx_t i;

  if(lastsuffix != 0) { ++first; }

#if SS_BLOCKSIZE == 0
  ss_mintrosort(T, PA, first, last, depth);
#else
  if((bufsize < SS_BLOCKSIZE) &&
      (bufsize < (last - first)) &&
      (bufsize < (limit = ss_isqrt(last - first)))) {
    if(SS_BLOCKSIZE < limit) { limit = SS_BLOCKSIZE; }
    buf = middle = last - limit, bufsize = limit;
  } else {
    middle = last, limit = 0;
  }
  for(a = first, i = 0; SS_BLOCKSIZE < (middle - a); a += SS_BLOCKSIZE, ++i) {
#if SS_INSERTIONSORT_THRESHOLD < SS_BLOCKSIZE
    ss_mintrosort(T, PA, a, a + SS_BLOCKSIZE, depth);
#elif 1 < SS_BLOCKSIZE
    ss_insertionsort(T, PA, a, a + SS_BLOCKSIZE, depth);
#endif
    curbufsize = last - (a + SS_BLOCKSIZE);
    curbuf = a + SS_BLOCKSIZE;
    if(curbufsize <= bufsize) { curbufsize = bufsize, curbuf = buf; }
    for(b = a, k = SS_BLOCKSIZE, j = i; j & 1; b -= k, k <<= 1, j >>= 1) {
      ss_swapmerge(T, PA, b - k, b, b + k, curbuf, curbufsize, depth);
    }
  }
#if SS_INSERTIONSORT_THRESHOLD < SS_BLOCKSIZE
  ss_mintrosort(T, PA, a, middle, depth);
#elif 1 < SS_BLOCKSIZE
  ss_insertionsort(T, PA, a, middle, depth);
#endif
  for(k = SS_BLOCKSIZE; i != 0; k <<= 1, i >>= 1) {
    if(i & 1) {
      ss_swapmerge(T, PA, a - k, a, middle, buf, bufsize, depth);
      a -= k;
    }
  }
  if(limit != 0) {
#if SS_INSERTIONSORT_THRESHOLD < SS_BLOCKSIZE
    ss_mintrosort(T, PA, middle, last, depth);
#elif 1 < SS_BLOCKSIZE
    ss_insertionsort(T, PA, middle, last, depth);
#endif
    ss_inplacemerge(T, PA, first, middle, last, depth);
  }
#endif

  if(lastsuffix != 0) {
    /* Insert last type B* suffix. */
    saidx_t PAi[2]; PAi[0] = PA[*(first - 1)], PAi[1] = n - 2;
    for(a = first, i = *(first - 1);
        (a < last) && ((*a < 0) || (0 < ss_compare(T, &(PAi[0]), PA + *a, depth)));
        ++a) {
      *(a - 1) = *a;
    }
    *(a - 1) = i;
  }
}